

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.cc
# Opt level: O3

void __thiscall gss::Timeout::Timeout(Timeout *this,seconds limit)

{
  _Head_base<0UL,_gss::Timeout::Detail_*,_false> _Var1;
  pointer *__ptr;
  thread local_28;
  long *local_20;
  
  _Var1._M_head_impl = (Detail *)operator_new(0x70);
  *(undefined8 *)_Var1._M_head_impl = 0;
  ((_Var1._M_head_impl)->timeout_thread)._M_id = (id)0x0;
  *(undefined8 *)&((_Var1._M_head_impl)->timeout_mutex).super___mutex_base = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->timeout_mutex + 8) = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->timeout_mutex + 0x10) = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->timeout_mutex + 0x18) = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->timeout_mutex + 0x20) = 0;
  *(undefined8 *)&(_Var1._M_head_impl)->timeout_cv = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->timeout_mutex + 0x20) = 0;
  *(undefined8 *)&(_Var1._M_head_impl)->timeout_cv = 0;
  *(undefined8 *)&(_Var1._M_head_impl)->field_0x40 = 0;
  *(undefined8 *)&(_Var1._M_head_impl)->field_0x48 = 0;
  *(undefined8 *)&(_Var1._M_head_impl)->field_0x50 = 0;
  *(undefined8 *)&(_Var1._M_head_impl)->field_0x58 = 0;
  *(undefined8 *)&(_Var1._M_head_impl)->field_0x60 = 0;
  *(undefined8 *)&(_Var1._M_head_impl)->abort = 0;
  std::condition_variable::condition_variable(&(_Var1._M_head_impl)->timeout_cv);
  ((_Var1._M_head_impl)->abort)._M_base = (__atomic_base<bool>)0x0;
  (this->_detail)._M_t.
  super___uniq_ptr_impl<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>._M_t.
  super__Tuple_impl<0UL,_gss::Timeout::Detail_*,_std::default_delete<gss::Timeout::Detail>_>.
  super__Head_base<0UL,_gss::Timeout::Detail_*,_false>._M_head_impl = _Var1._M_head_impl;
  LOCK();
  ((_Var1._M_head_impl)->abort)._M_base = (__atomic_base<bool>)0x0;
  UNLOCK();
  if (limit.__r != 0) {
    local_28._M_id._M_thread = (id)0;
    local_20 = (long *)operator_new(0x18);
    *local_20 = (long)&PTR___State_001a0800;
    local_20[1] = limit.__r;
    local_20[2] = (long)this;
    std::thread::_M_start_thread(&local_28,&local_20,0);
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 8))();
    }
    _Var1._M_head_impl =
         (this->_detail)._M_t.
         super___uniq_ptr_impl<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>.
         _M_t.
         super__Tuple_impl<0UL,_gss::Timeout::Detail_*,_std::default_delete<gss::Timeout::Detail>_>.
         super__Head_base<0UL,_gss::Timeout::Detail_*,_false>._M_head_impl;
    if ((native_handle_type)((_Var1._M_head_impl)->timeout_thread)._M_id != 0) {
      std::terminate();
    }
    ((_Var1._M_head_impl)->timeout_thread)._M_id = local_28._M_id._M_thread;
  }
  return;
}

Assistant:

Timeout::Timeout(const seconds limit) :
    _detail(make_unique<Detail>())
{
    _detail->abort.store(false);
    if (0s != limit) {
        _detail->timeout_thread = thread([limit, &detail = this->_detail] {
            auto abort_time = system_clock::now() + limit;
            {
                /* Sleep until either we've reached the time limit,
                 * or we've finished all the work. */
                unique_lock<mutex> guard(detail->timeout_mutex);
                while (! detail->abort.load()) {
                    if (cv_status::timeout == detail->timeout_cv.wait_until(guard, abort_time)) {
                        /* We've woken up, and it's due to a timeout. */
                        detail->aborted = true;
                        break;
                    }
                }
            }
            detail->abort.store(true);
        });
    }
}